

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall
cmMakefile::ReadListFile(cmMakefile *this,cmListFile *listFile,string *filenametoread)

{
  cmStateSnapshot *pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  bool bVar5;
  string *psVar6;
  long lVar7;
  long lVar8;
  cmExecutionStatus status;
  string currentFile;
  string currentParentFile;
  string local_b8;
  string local_98;
  string local_78;
  long *local_58 [2];
  long local_48 [2];
  cmStateSnapshot *local_38;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->ListFiles,filenametoread);
  paVar2 = &local_98.field_2;
  local_98._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"CMAKE_PARENT_LIST_FILE","");
  psVar6 = GetSafeDefinition(this,&local_98);
  local_58[0] = local_48;
  pcVar4 = (psVar6->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_58,pcVar4,pcVar4 + psVar6->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  paVar3 = &local_b8.field_2;
  local_b8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"CMAKE_CURRENT_LIST_FILE","");
  psVar6 = GetSafeDefinition(this,&local_b8);
  pcVar4 = (psVar6->_M_dataplus)._M_p;
  local_98._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar4,pcVar4 + psVar6->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar3) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"CMAKE_CURRENT_LIST_FILE","");
  AddDefinition(this,&local_b8,(filenametoread->_M_dataplus)._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar3) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"CMAKE_CURRENT_LIST_DIR","");
  cmsys::SystemTools::GetFilenamePath(&local_78,filenametoread);
  AddDefinition(this,&local_b8,local_78._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar3) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"CMAKE_PARENT_LIST_FILE","");
  pcVar1 = &this->StateSnapshot;
  cmStateSnapshot::GetDefinition(pcVar1,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar3) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"CMAKE_CURRENT_LIST_FILE","");
  cmStateSnapshot::GetDefinition(pcVar1,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar3) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"CMAKE_CURRENT_LIST_DIR","");
  cmStateSnapshot::GetDefinition(pcVar1,&local_b8);
  local_38 = pcVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar3) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  lVar7 = (long)(listFile->Functions).
                super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(listFile->Functions).
                super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar7 != 0) {
    lVar7 = (lVar7 >> 5) * -0x5555555555555555;
    lVar7 = lVar7 + -1 + (ulong)(lVar7 == 0);
    lVar8 = 0;
    while( true ) {
      local_b8._M_dataplus._M_p = local_b8._M_dataplus._M_p & 0xffffffff00000000;
      ExecuteCommand(this,(cmListFileFunction *)
                          ((long)&(((listFile->Functions).
                                    super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super_cmCommandContext).Name + lVar8),
                     (cmExecutionStatus *)&local_b8);
      if (cmSystemTools::s_FatalErrorOccured != false) break;
      bVar5 = cmSystemTools::GetInterruptFlag();
      if (bVar5) break;
      bVar5 = lVar7 == 0;
      lVar7 = lVar7 + -1;
      if (((char)local_b8._M_dataplus._M_p != '\0') || (lVar8 = lVar8 + 0x60, bVar5)) break;
    }
  }
  CheckForUnusedVariables(this);
  paVar2 = &local_b8.field_2;
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"CMAKE_PARENT_LIST_FILE","");
  AddDefinition(this,&local_b8,(char *)local_58[0]);
  pcVar1 = local_38;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"CMAKE_CURRENT_LIST_FILE","");
  AddDefinition(this,&local_b8,local_98._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"CMAKE_CURRENT_LIST_DIR","");
  cmsys::SystemTools::GetFilenamePath(&local_78,&local_98);
  AddDefinition(this,&local_b8,local_78._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"CMAKE_PARENT_LIST_FILE","");
  cmStateSnapshot::GetDefinition(pcVar1,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"CMAKE_CURRENT_LIST_FILE","");
  cmStateSnapshot::GetDefinition(pcVar1,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  local_b8._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"CMAKE_CURRENT_LIST_DIR","");
  cmStateSnapshot::GetDefinition(pcVar1,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  return;
}

Assistant:

void cmMakefile::ReadListFile(cmListFile const& listFile,
                              std::string const& filenametoread)
{
  // add this list file to the list of dependencies
  this->ListFiles.push_back(filenametoread);

  std::string currentParentFile =
    this->GetSafeDefinition("CMAKE_PARENT_LIST_FILE");
  std::string currentFile = this->GetSafeDefinition("CMAKE_CURRENT_LIST_FILE");

  this->AddDefinition("CMAKE_CURRENT_LIST_FILE", filenametoread.c_str());
  this->AddDefinition("CMAKE_CURRENT_LIST_DIR",
                      cmSystemTools::GetFilenamePath(filenametoread).c_str());

  this->MarkVariableAsUsed("CMAKE_PARENT_LIST_FILE");
  this->MarkVariableAsUsed("CMAKE_CURRENT_LIST_FILE");
  this->MarkVariableAsUsed("CMAKE_CURRENT_LIST_DIR");

  // Run the parsed commands.
  const size_t numberFunctions = listFile.Functions.size();
  for (size_t i = 0; i < numberFunctions; ++i) {
    cmExecutionStatus status;
    this->ExecuteCommand(listFile.Functions[i], status);
    if (cmSystemTools::GetFatalErrorOccured()) {
      break;
    }
    if (status.GetReturnInvoked()) {
      // Exit early due to return command.
      break;
    }
  }
  this->CheckForUnusedVariables();

  this->AddDefinition("CMAKE_PARENT_LIST_FILE", currentParentFile.c_str());
  this->AddDefinition("CMAKE_CURRENT_LIST_FILE", currentFile.c_str());
  this->AddDefinition("CMAKE_CURRENT_LIST_DIR",
                      cmSystemTools::GetFilenamePath(currentFile).c_str());
  this->MarkVariableAsUsed("CMAKE_PARENT_LIST_FILE");
  this->MarkVariableAsUsed("CMAKE_CURRENT_LIST_FILE");
  this->MarkVariableAsUsed("CMAKE_CURRENT_LIST_DIR");
}